

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O1

int json2map_parseObject
              (json2map_t *obj,char *path,char *jsonString,jsmntok_t *token,int start,int end)

{
  int iVar1;
  jsmntype_t jVar2;
  char *pcVar3;
  csafestring_t *obj_00;
  csafestring_t *pcVar4;
  csafestring_t *pcVar5;
  char *__dest;
  csafestring_t *obj_01;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint arrayIdx;
  long lVar14;
  char smallBuffer [25];
  char local_58 [40];
  
  if (0 < start && start < end) {
    do {
      uVar9 = (ulong)(uint)start;
      if (token[uVar9].type != JSMN_STRING) {
        return -1;
      }
      iVar1 = token[uVar9].start;
      lVar13 = (long)token[uVar9].end - (long)iVar1;
      pcVar3 = (char *)calloc(1,lVar13 + 1);
      memcpy(pcVar3,jsonString + iVar1,(long)(int)lVar13);
      obj_00 = json2map_concatPaths(path,pcVar3,-1);
      free(pcVar3);
      lVar13 = uVar9 + 1;
      jVar2 = token[lVar13].type;
      if (jVar2 - JSMN_STRING < 2) {
        iVar1 = token[lVar13].start;
        lVar13 = (long)token[lVar13].end - (long)iVar1;
        pcVar3 = (char *)calloc(1,lVar13 + 1);
        memcpy(pcVar3,jsonString + iVar1,(long)(int)lVar13);
        if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
          (*obj->dataMapHook)(obj->dataMapData,obj_00->data,pcVar3);
        }
        free(pcVar3);
        start = start + 2;
      }
      else {
        uVar6 = (ulong)(start + 1);
        if (jVar2 == JSMN_ARRAY) {
          piVar7 = &token[uVar6 + 1].start;
          uVar8 = start;
          do {
            uVar6 = uVar6 + 1;
            uVar12 = end - 1;
            if ((long)end <= (long)uVar6) break;
            iVar1 = *piVar7;
            uVar12 = uVar8 + 1;
            piVar7 = piVar7 + 4;
            uVar8 = uVar12;
          } while (iVar1 <= token[lVar13].end);
          pcVar3 = obj_00->data;
          uVar8 = start + 2;
          if (start < -1 || (int)uVar12 < (int)uVar8) {
            uVar9 = 0;
          }
          else {
            arrayIdx = 0;
            do {
              uVar9 = (ulong)uVar8;
              pcVar4 = json2map_concatPaths((char *)0x0,pcVar3,arrayIdx);
              if (token[uVar9].type - JSMN_STRING < 2) {
                iVar1 = token[uVar9].start;
                lVar13 = (long)token[uVar9].end - (long)iVar1;
                __dest = (char *)calloc(1,lVar13 + 1);
                memcpy(__dest,jsonString + iVar1,(long)(int)lVar13);
                if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
                  (*obj->dataMapHook)(obj->dataMapData,pcVar4->data,__dest);
                }
                free(__dest);
                uVar8 = uVar8 + 1;
              }
              else {
                if (token[uVar9].type != JSMN_OBJECT) {
                  start = 0xffffffff;
                  goto LAB_0010675c;
                }
                uVar10 = uVar8 - 1;
                piVar7 = &token[uVar9 + 1].start;
                uVar6 = uVar9;
                do {
                  uVar6 = uVar6 + 1;
                  uVar11 = uVar12;
                  if ((long)(int)(uVar12 + 1) <= (long)uVar6) break;
                  iVar1 = *piVar7;
                  uVar10 = uVar10 + 1;
                  piVar7 = piVar7 + 4;
                  uVar11 = uVar10;
                } while (iVar1 <= token[uVar9].end);
                if (obj->saveSubobjectString != '\0') {
                  pcVar5 = safe_clone(pcVar4);
                  safe_strchrappend(pcVar5,'[');
                  safe_strchrappend(pcVar5,'o');
                  safe_strchrappend(pcVar5,']');
                  obj_01 = safe_create((char *)0x0);
                  safe_memset(obj_01,0,(long)((token[uVar9].end - token[uVar9].start) + 1));
                  safe_memcpy(obj_01,jsonString + token[uVar9].start,
                              (long)token[uVar9].end - (long)token[uVar9].start);
                  (*obj->dataMapHook)(obj->dataMapData,pcVar5->data,obj_01->data);
                  safe_destroy(obj_01);
                  safe_destroy(pcVar5);
                }
                uVar8 = json2map_parseObject(obj,pcVar4->data,jsonString,token,uVar8 + 1,uVar11 + 1)
                ;
              }
              arrayIdx = arrayIdx + 1;
              safe_destroy(pcVar4);
            } while (((int)uVar8 <= (int)uVar12) && (0 < (int)uVar8));
            uVar9 = (ulong)arrayIdx;
          }
          pcVar4 = json2map_concatPaths((char *)0x0,pcVar3,-2);
          stringlib_longToString(local_58,uVar9);
          if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
            (*obj->dataMapHook)(obj->dataMapData,pcVar4->data,local_58);
          }
          safe_destroy(pcVar4);
          start = uVar12 + 1;
          if ((int)uVar8 < 0) {
            start = uVar8;
          }
        }
        else {
          if (jVar2 != JSMN_OBJECT) {
            return -1;
          }
          piVar7 = &token[uVar9 + 2].start;
          lVar14 = uVar9 + 2;
          do {
            uVar8 = end;
            if (end <= lVar14) break;
            iVar1 = *piVar7;
            uVar8 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar8;
            piVar7 = piVar7 + 4;
            lVar14 = lVar14 + 1;
          } while (iVar1 <= token[lVar13].end);
          if (obj->saveSubobjectString != '\0') {
            pcVar4 = safe_clone(obj_00);
            safe_strchrappend(pcVar4,'[');
            safe_strchrappend(pcVar4,'o');
            safe_strchrappend(pcVar4,']');
            pcVar5 = safe_create((char *)0x0);
            safe_memset(pcVar5,0,(long)((token[lVar13].end - token[lVar13].start) + 1));
            safe_memcpy(pcVar5,jsonString + token[lVar13].start,
                        (long)token[lVar13].end - (long)token[lVar13].start);
            (*obj->dataMapHook)(obj->dataMapData,pcVar4->data,pcVar5->data);
            safe_destroy(pcVar5);
            safe_destroy(pcVar4);
          }
          start = json2map_parseObject(obj,obj_00->data,jsonString,token,start + 2,uVar8);
        }
      }
LAB_0010675c:
      safe_destroy(obj_00);
    } while ((start < end) && (0 < start));
  }
  if (start < 0) {
    end = start;
  }
  return end;
}

Assistant:

static int json2map_parseObject(json2map_t *obj, char *path, char *jsonString, jsmntok_t *token, int start, int end) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)...", path, jsonString, start, end);

	int newEnd;
	char *buffer;
	csafestring_t *pathBuff = NULL;
	csafestring_t *objPathBuff = NULL;

	int i = start;
	while ( i < end && i > 0 ) {
		if ( token[i].type == JSMN_STRING ) {
			buffer = json2map_setTokenValue(jsonString, &token[i]);
			pathBuff = json2map_concatPaths(path, buffer, -1);
			free(buffer);
		} else {
			DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Name of object has to be a string", path, jsonString, start, end);
			return -1;
		}
		i++;

		switch ( token[i].type ) {
			case JSMN_OBJECT:
				newEnd = json2map_calcEnd(token, i, end);

				if ( obj->saveSubobjectString ) {
					objPathBuff = safe_clone(pathBuff);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_START);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_OBJECT_CODE);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_END);
					
					csafestring_t *tmp = safe_create(NULL);
					safe_memset(tmp, '\0', token[i].end - token[i].start + 1);
					safe_memcpy(tmp, &jsonString[token[i].start], token[i].end - token[i].start);

					obj->dataMapHook(obj->dataMapData, objPathBuff->data, tmp->data);
					safe_destroy(tmp);
					safe_destroy(objPathBuff);
				}

				i = json2map_parseObject(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			case JSMN_STRING:
			case JSMN_PRIMITIVE:
				buffer = json2map_setTokenValue(jsonString, &token[i]);
				if ( obj->dataMapHook != NULL ) {
					obj->dataMapHook(obj->dataMapData, pathBuff->data, buffer);
				}
				free(buffer);
				i++;
				break;
			case JSMN_ARRAY:
				newEnd = json2map_calcEnd(token, i, end);
				i = json2map_parseArray(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			default:
				DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Not defined type", path, jsonString, start, end);
				return -1;
		}
		safe_destroy(pathBuff);
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)... DONE", path, jsonString, start, end);
	if ( i < 0 ) {
		return i;
	}
	return end;
}